

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_postProcessSequenceProducerResult
                 (ZSTD_Sequence *outSeqs,size_t nbExternalSeqs,size_t outSeqsCapacity,size_t srcSize
                 )

{
  undefined8 *puVar1;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  void *in_RDI;
  ZSTD_Sequence lastSeq;
  int local_38;
  int local_30;
  size_t local_8;
  
  if (in_RDX < in_RSI) {
    local_8 = 0xffffffffffffff96;
  }
  else if ((in_RSI == 0) && (in_RCX != 0)) {
    local_8 = 0xffffffffffffff96;
  }
  else if (in_RCX == 0) {
    memset(in_RDI,0,0x10);
    local_8 = 1;
  }
  else {
    puVar1 = (undefined8 *)((long)in_RDI + (in_RSI - 1) * 0x10);
    local_38 = (int)*puVar1;
    if ((local_38 != 0) || (local_30 = (int)puVar1[1], local_8 = in_RSI, local_30 != 0)) {
      if (in_RSI == in_RDX) {
        local_8 = 0xffffffffffffff96;
      }
      else {
        memset((void *)((long)in_RDI + in_RSI * 0x10),0,0x10);
        local_8 = in_RSI + 1;
      }
    }
  }
  return local_8;
}

Assistant:

static size_t ZSTD_postProcessSequenceProducerResult(
    ZSTD_Sequence* outSeqs, size_t nbExternalSeqs, size_t outSeqsCapacity, size_t srcSize
) {
    RETURN_ERROR_IF(
        nbExternalSeqs > outSeqsCapacity,
        sequenceProducer_failed,
        "External sequence producer returned error code %lu",
        (unsigned long)nbExternalSeqs
    );

    RETURN_ERROR_IF(
        nbExternalSeqs == 0 && srcSize > 0,
        sequenceProducer_failed,
        "Got zero sequences from external sequence producer for a non-empty src buffer!"
    );

    if (srcSize == 0) {
        ZSTD_memset(&outSeqs[0], 0, sizeof(ZSTD_Sequence));
        return 1;
    }

    {
        ZSTD_Sequence const lastSeq = outSeqs[nbExternalSeqs - 1];

        /* We can return early if lastSeq is already a block delimiter. */
        if (lastSeq.offset == 0 && lastSeq.matchLength == 0) {
            return nbExternalSeqs;
        }

        /* This error condition is only possible if the external matchfinder
         * produced an invalid parse, by definition of ZSTD_sequenceBound(). */
        RETURN_ERROR_IF(
            nbExternalSeqs == outSeqsCapacity,
            sequenceProducer_failed,
            "nbExternalSeqs == outSeqsCapacity but lastSeq is not a block delimiter!"
        );

        /* lastSeq is not a block delimiter, so we need to append one. */
        ZSTD_memset(&outSeqs[nbExternalSeqs], 0, sizeof(ZSTD_Sequence));
        return nbExternalSeqs + 1;
    }
}